

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

MixingHashState
absl::lts_20250127::hash_internal::HashStateBase<absl::lts_20250127::hash_internal::MixingHashState>
::combine<std::basic_string_view<char,std::char_traits<char>>,int>
          (MixingHashState state,basic_string_view<char,_std::char_traits<char>_> *value,int *values
          )

{
  enable_if_t<std::is_same<MixingHashState,_decltype(AbslHashValue(std::move(state),_value))>::value,_absl::lts_20250127::hash_internal::MixingHashState>
  eVar1;
  ulong uVar2;
  uchar *start;
  
  eVar1 = HashSelect::HashValueProbe::
          Invoke<absl::lts_20250127::hash_internal::MixingHashState,std::basic_string_view<char,std::char_traits<char>>>
                    (state,value);
  uVar2 = (eVar1.state_ ^ (uint)*values) * -0x234dd359734ecb13;
  return (MixingHashState)
         (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
}

Assistant:

H HashStateBase<H>::combine(H state, const T& value, const Ts&... values) {
  return H::combine(hash_internal::HashSelect::template Apply<T>::Invoke(
                        std::move(state), value),
                    values...);
}